

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnSimdShuffleOp(TypeChecker *this,Opcode opcode,v128 lane_idx)

{
  bool bVar1;
  Result RVar2;
  int i;
  long lVar3;
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = lane_idx.v._0_8_;
  local_30 = lane_idx.v._8_8_;
  lVar3 = 0;
  bVar1 = false;
  do {
    if (0x1f < *(byte *)((long)&local_38 + lVar3)) {
      PrintError(this,"lane index must be less than 32 (got %d)");
      bVar1 = true;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  RVar2 = CheckOpcode2(this,opcode);
  RVar2.enum_._0_1_ = RVar2.enum_ == Error || bVar1;
  RVar2.enum_._1_3_ = 0;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnSimdShuffleOp(Opcode opcode, v128 lane_idx) {
  Result result = Result::Ok;
  uint8_t simd_data[16];
  memcpy(simd_data, &lane_idx, 16);
  for (int i = 0; i < 16; i++) {
    if (simd_data[i] >= 32) {
      PrintError("lane index must be less than 32 (got %d)", simd_data[i]);
      result = Result::Error;
    }
  }

  result |= CheckOpcode2(opcode);
  return result;
}